

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Result __thiscall wabt::interp::Memory::Fill(Memory *this,u64 offset,u8 value,u64 size)

{
  bool bVar1;
  Enum EVar2;
  
  EVar2 = Ok;
  bVar1 = IsValidAccess(this,offset,0,size);
  if (bVar1) {
    if (size != 0) {
      memset((this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start + offset,(uint)value,size);
    }
  }
  else {
    EVar2 = Error;
  }
  return (Result)EVar2;
}

Assistant:

Result Memory::Fill(u64 offset, u8 value, u64 size) {
  if (IsValidAccess(offset, 0, size)) {
#if WABT_BIG_ENDIAN
    std::fill(data_.end() - offset - size, data_.end() - offset, value);
#else
    std::fill(data_.begin() + offset, data_.begin() + offset + size, value);
#endif
    return Result::Ok;
  }
  return Result::Error;
}